

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O1

int arangodb::velocypack::fpconv_dtoa(double d,char *dest)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  sbyte sVar9;
  byte bVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint64_t *puVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int unaff_R12D;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  Fp FVar31;
  Fp FVar32;
  char digits [18];
  ulong local_d0;
  undefined8 local_c0;
  char local_b8 [32];
  char *local_98;
  ulong local_90;
  long local_88;
  Fp local_80;
  Fp local_70;
  double local_60;
  long local_58;
  Fp local_50;
  Fp local_40;
  
  bVar30 = (long)d < 0;
  if (bVar30) {
    *dest = '-';
  }
  local_98 = dest + bVar30;
  if ((d != 0.0) || (NAN(d))) {
    if ((~(ulong)d & 0x7ff0000000000000) != 0) {
      uVar21 = 0;
      bVar29 = true;
      goto LAB_0011283e;
    }
    if (((ulong)d & 0xfffffffffffff) == 0) {
      local_98[0] = 'i';
      local_98[1] = 'n';
      local_98[2] = 'f';
    }
    else {
      local_98[0] = 'N';
      local_98[1] = 'a';
      local_98[2] = 'N';
    }
    uVar21 = 3;
  }
  else {
    *local_98 = '0';
    uVar21 = 1;
  }
  bVar29 = false;
LAB_0011283e:
  if (bVar29) {
    uVar20 = (ulong)d & 0xfffffffffffff;
    uVar21 = (uint)((ulong)d >> 0x34) & 0x7ff;
    local_70.exp = -0x432;
    if (uVar21 != 0) {
      local_70.exp = uVar21 - 0x433;
    }
    local_b8[0] = '\0';
    uVar15 = uVar20 + 0x10000000000000;
    if (uVar21 == 0) {
      uVar15 = uVar20;
    }
    local_80.frac = uVar15 * 2 + 1;
    iVar11 = local_70.exp;
    if (uVar21 == 0) {
      lVar16 = 0x3f;
      if ((local_80.frac & 0x1fffffffffffff) != 0) {
        for (; (local_80.frac & 0x1fffffffffffff) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      local_80.frac = local_80.frac << (~(byte)lVar16 + 0x36 & 0x3f);
      iVar11 = (local_70.exp - ((uint)lVar16 ^ 0x3f)) + 10;
    }
    local_80.frac = local_80.frac << 10;
    local_80.exp = iVar11 + -0xb;
    sVar9 = (uVar15 == 0x10000000000000) + 1;
    local_50.frac =
         (uVar15 << sVar9) + -1 << (((char)local_70.exp - sVar9) - (char)local_80.exp & 0x3fU);
    if (uVar21 == 0) {
      lVar16 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      uVar15 = uVar15 << (~(byte)lVar16 + 0x35 & 0x3f);
      local_70.exp = (local_70.exp - ((uint)lVar16 ^ 0x3f)) + 0xb;
    }
    local_70.frac = uVar15 << 0xb;
    iVar13 = local_70.exp + -0xb;
    iVar5 = (int)((double)(-0x4c - iVar11) * 0.30102999566398114);
    iVar11 = iVar5 + 0x15c;
    iVar5 = iVar5 + 0x163;
    if (-1 < iVar11) {
      iVar5 = iVar11;
    }
    iVar5 = iVar5 >> 3;
    local_40.frac = local_80.frac;
    do {
      local_40.exp = powers_ten[iVar5].exp;
      if (local_40.exp + local_80.exp < -0x7c) {
        iVar5 = iVar5 + 1;
LAB_001129b0:
        bVar29 = true;
        local_40.exp = local_70.exp;
      }
      else {
        if (-0x60 < local_40.exp + local_80.exp) {
          iVar5 = iVar5 + -1;
          goto LAB_001129b0;
        }
        unaff_R12D = iVar5 * 8 + -0x15c;
        local_40.frac = powers_ten[iVar5].frac;
        bVar29 = false;
      }
      local_70.exp = local_40.exp;
    } while (bVar29);
    local_70.exp = iVar13;
    local_60 = d;
    local_50.exp = local_80.exp;
    FVar31 = multiply(&local_70,&local_40);
    uVar7 = FVar31.frac;
    local_70.exp = FVar31.exp;
    local_70.frac = uVar7;
    FVar31 = multiply(&local_80,&local_40);
    uVar8 = FVar31.frac;
    local_80.exp = FVar31.exp;
    local_80.frac = uVar8;
    FVar32 = multiply(&local_50,&local_40);
    local_d0 = FVar32.frac;
    local_50.exp = FVar32.exp;
    local_50.frac = local_d0 + 1;
    local_80.frac = uVar8 - 1;
    uVar15 = (ulong)(uint)-unaff_R12D;
    uVar28 = local_80.frac - uVar7;
    bVar10 = -(char)FVar31.exp;
    uVar22 = 1L << (bVar10 & 0x3f);
    uVar20 = local_80.frac - (local_d0 + 1);
    local_c0 = uVar22 - 1;
    uVar24 = local_c0 & local_80.frac;
    uVar27 = local_80.frac >> (bVar10 & 0x3f);
    local_58 = (uVar8 - local_d0) + -2;
    local_88 = (uVar7 - uVar8) + 1;
    iVar11 = 0;
    puVar14 = tens + 10;
    uVar21 = 10;
    do {
      uVar23 = *puVar14;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar23;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar27;
      auVar2 = auVar2 / auVar1;
      uVar12 = 0;
      if (iVar11 != 0 || (auVar2 & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0) {
        local_b8[iVar11] = auVar2[0] + '0';
        uVar12 = (ulong)(iVar11 + 1);
      }
      uVar27 = uVar27 - (auVar2._0_8_ & 0xffffffff) * uVar23;
      lVar16 = uVar27 << (bVar10 & 0x3f);
      uVar26 = lVar16 + uVar24;
      iVar11 = (int)uVar12;
      if (uVar26 <= uVar20) {
        uVar15 = (ulong)((int)uVar15 + (uVar21 - 1));
        uVar23 = uVar23 << (bVar10 & 0x3f);
        local_d0 = uVar12;
        if ((uVar26 < uVar28) && (uVar23 <= uVar20 - uVar26)) {
          local_90 = uVar15;
          uVar19 = uVar28 - uVar26;
          uVar17 = lVar16 + uVar24 + uVar23;
          uVar25 = local_58 - uVar17;
          do {
            if ((uVar28 <= uVar17) && (uVar15 = local_90, uVar19 <= local_88 + uVar17)) break;
            local_b8[(long)iVar11 + -1] = local_b8[(long)iVar11 + -1] + -1;
            bVar29 = uVar23 <= uVar25;
            uVar25 = uVar25 - uVar23;
            uVar15 = local_90;
            if (uVar28 <= uVar17) break;
            uVar19 = uVar19 - uVar23;
            uVar17 = uVar17 + uVar23;
          } while (bVar29);
        }
      }
      if (uVar26 <= uVar20) {
        iVar11 = (int)local_d0;
        goto LAB_00112c79;
      }
      puVar14 = puVar14 + 1;
      bVar29 = 1 < uVar21;
      uVar21 = uVar21 - 1;
    } while (bVar29);
    local_88 = -uVar28;
    puVar18 = tens + 0x12;
    iVar13 = 0;
    do {
      uVar27 = uVar24 * 10 >> (bVar10 & 0x3f);
      iVar11 = (int)uVar12;
      uVar21 = 0;
      if ((int)uVar27 != 0 || iVar11 != 0) {
        uVar21 = iVar11 + 1;
        local_b8[iVar11] = (char)uVar27 + '0';
      }
      uVar12 = (ulong)uVar21;
      uVar20 = uVar20 * 10;
      iVar13 = iVar13 + -1;
      uVar24 = uVar24 * 10 & local_c0;
      if (uVar20 < uVar24 || uVar20 - uVar24 == 0) {
        puVar18 = puVar18 + -1;
      }
      else {
        uVar15 = (ulong)(uint)((int)uVar15 + iVar13);
        if (uVar22 <= uVar20 - uVar24) {
          uVar27 = *puVar18 * uVar28;
          uVar23 = uVar27 - uVar24;
          if (uVar24 <= uVar27 && uVar23 != 0) {
            uVar26 = uVar22 + uVar24;
            uVar17 = uVar20 - uVar26;
            lVar16 = *puVar18 * local_88;
            do {
              if ((uVar27 <= uVar26) && (uVar23 <= lVar16 + uVar26)) break;
              local_b8[(long)(int)uVar21 + -1] = local_b8[(long)(int)uVar21 + -1] + -1;
              bVar29 = uVar22 <= uVar17;
              uVar17 = uVar17 - uVar22;
              if (uVar27 <= uVar26) break;
              uVar23 = uVar23 - uVar22;
              uVar26 = uVar26 + uVar22;
            } while (bVar29);
            local_d0 = (ulong)uVar21;
            goto LAB_00112c69;
          }
        }
        local_d0 = (ulong)uVar21;
      }
LAB_00112c69:
      iVar11 = (int)local_d0;
    } while (uVar20 <= uVar24);
LAB_00112c79:
    pcVar4 = local_98;
    iVar13 = (int)uVar15;
    uVar21 = iVar13 + iVar11;
    uVar3 = iVar11 + -1 + iVar13;
    if ((int)uVar21 < 1) {
      uVar3 = 1 - uVar21;
    }
    if ((iVar13 < 0) || (iVar11 + 7 <= (int)uVar3)) {
      if ((iVar13 < 0) && ((-7 < iVar13 || ((int)uVar3 < 4)))) {
        if ((int)uVar21 < 1) {
          local_98[0] = '0';
          local_98[1] = '.';
          memset(local_98 + 2,0x30,(ulong)-uVar21);
          memcpy(pcVar4 + (ulong)-uVar21 + 2,local_b8,(long)iVar11);
          uVar21 = (iVar11 - uVar21) + 2;
        }
        else {
          uVar20 = (ulong)uVar21;
          memcpy(local_98,local_b8,uVar20);
          pcVar4[uVar20] = '.';
          memcpy(pcVar4 + uVar20 + 1,local_b8 + uVar20,(ulong)(uint)-iVar13);
          uVar21 = iVar11 + 1;
        }
      }
      else {
        iVar5 = (int)((long)local_60 >> 0x3f) + 0x12;
        if (iVar11 <= iVar5) {
          iVar5 = iVar11;
        }
        *local_98 = local_b8[0];
        uVar21 = 1;
        if (1 < iVar11) {
          local_98[1] = '.';
          memcpy(local_98 + 2,local_b8 + 1,(ulong)(iVar5 - 1));
          uVar21 = iVar5 + 1;
        }
        local_98[uVar21] = 'e';
        uVar20 = (ulong)uVar21 + 2;
        local_98[(long)(int)uVar21 + 1] =
             (iVar5 + iVar13 == 0 || SCARRY4(iVar5,iVar13) != iVar5 + iVar13 < 0) * '\x02' + '+';
        uVar6 = uVar3;
        if (99 < (int)uVar3) {
          local_98[uVar20] = (char)((ulong)uVar3 / 100) + '0';
          uVar6 = uVar3 % 100;
          uVar20 = (ulong)(uVar21 + 3);
        }
        if ((int)uVar6 < 10) {
          if (99 < (int)uVar3) {
            uVar15 = uVar20 & 0xffffffff;
            uVar20 = (ulong)((int)uVar20 + 1);
            local_98[uVar15] = '0';
          }
        }
        else {
          uVar15 = uVar20 & 0xffffffff;
          uVar20 = (ulong)((int)uVar20 + 1);
          local_98[uVar15] = (char)((ulong)uVar6 / 10) + '0';
          uVar6 = uVar6 % 10;
        }
        uVar21 = (int)uVar20 + 1;
        local_98[uVar20 & 0xffffffff] =
             (char)uVar6 +
             ((char)(uint)((ulong)((long)(int)uVar6 * 0x66666667) >> 0x22) -
             (char)((int)uVar6 >> 0x1f)) * -10 + '0';
      }
    }
    else {
      memcpy(local_98,local_b8,(long)iVar11);
      memset(pcVar4 + iVar11,0x30,uVar15 & 0xffffffff);
    }
  }
  return uVar21 + bVar30;
}

Assistant:

static inline uint64_t get_dbits(double d) {
  uint64_t r;
  std::memcpy(&r, &d, sizeof(uint64_t));
  return r;
}